

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O3

bool __thiscall RealTrafficConnection::ProcessFetchedData(RealTrafficConnection *this)

{
  RTRequestTypeTy RVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  JSON_Value *value;
  JSON_Object *pJVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  rep rVar10;
  long lVar11;
  JSON_Array *pData;
  duration dVar12;
  size_t sVar13;
  JSON_Object *pBuf;
  char *pcVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  string s;
  string metar;
  string rMsg;
  string local_a8;
  double local_80;
  allocator<char> local_71;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos == 0) {
    if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.httpResponse == 200) {
      return false;
    }
LAB_001940e0:
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    return false;
  }
  value = json_parse_string((char *)0x193f1c);
  if (value == (JSON_Value *)0x0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1c0,"ProcessFetchedData",logERR,"Parsing flight data as JSON failed");
    }
    goto LAB_001940e0;
  }
  pJVar6 = json_object(value);
  if (pJVar6 == (JSON_Object *)0x0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1c2,"ProcessFetchedData",logERR,"JSON: Getting main object failed");
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
LAB_00194170:
    bVar4 = false;
    goto LAB_001943df;
  }
  dVar2 = json_object_dotget_number(pJVar6,"status");
  lVar7 = lround(dVar2);
  if (lVar7 == 0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1c6,"ProcessFetchedData",logERR,"Response has no \'status\'");
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    goto LAB_00194170;
  }
  pcVar8 = jog_s(pJVar6,"message");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,pcVar8,(allocator<char> *)&local_a8);
  if (((lVar7 != 200) && ((this->curr).eRequType == RT_REQU_WEATHER)) &&
     (iVar5 = (this->rtWx).nErr, (this->rtWx).nErr = iVar5 + 1, 3 < iVar5)) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1cf,"ProcessFetchedData",logERR,
             "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude."
            );
    }
    CreateMsgWindow(12.0,logERR,
                    "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude."
                   );
  }
  switch(lVar7) {
  case 0x191:
    if ((int)dataRefs.iLogLevel < 1) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1ed,"ProcessFetchedData",logDEBUG,"Session expired");
    }
    (this->curr).sGUID._M_string_length = 0;
    *(this->curr).sGUID._M_dataplus._M_p = '\0';
    rVar10 = std::chrono::_V2::steady_clock::now();
    (this->tNextWeather).__d.__r = rVar10;
    (this->tNextTraffic).__d.__r = rVar10;
    break;
  case 0x192:
  case 0x194:
    if ((this->curr).eRequType == RT_REQU_AUTH) {
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
               ,0x1da,"ProcessFetchedData",logERR,"RealTraffic license invalid: %s",local_50[0]);
      }
      CreateMsgWindow(12.0,logERR,"RealTraffic license invalid: %s",local_50[0]);
      bVar4 = false;
      (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[7])
                (this,0,1);
      goto LAB_001943c4;
    }
    if ((int)dataRefs.iLogLevel < 3) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1de,"ProcessFetchedData",logWARN,"RealTraffic returned: %s",local_50[0]);
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    goto LAB_001943a2;
  case 0x193:
    if ((int)dataRefs.iLogLevel < 3) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,499,"ProcessFetchedData",logWARN,"RealTraffic forbidden: %s",local_50[0]);
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
LAB_001943a2:
    lVar7 = std::chrono::_V2::steady_clock::now();
    (this->tNextWeather).__d.__r = lVar7 + 5000000000;
    (this->tNextTraffic).__d.__r = lVar7 + 5000000000;
    break;
  case 0x195:
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1e5,"ProcessFetchedData",logERR,"RealTraffic: %s",local_50[0]);
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    lVar7 = std::chrono::_V2::steady_clock::now();
    (this->tNextWeather).__d.__r = lVar7 + 10000000000;
    (this->tNextTraffic).__d.__r = lVar7 + 10000000000;
    (this->curr).sGUID._M_string_length = 0;
    *(this->curr).sGUID._M_dataplus._M_p = '\0';
    break;
  default:
    if (lVar7 != 200) {
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
               ,0x1fa,"ProcessFetchedData",logERR,"RealTraffic returned an error: %s",local_50[0]);
      }
      CreateMsgWindow(12.0,logERR,"RealTraffic returned an error: %s",local_50[0]);
      (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
                (this);
      goto LAB_001943a2;
    }
    dVar2 = json_object_dotget_number(pJVar6,"rrl");
    lVar7 = lround(dVar2);
    dVar2 = json_object_dotget_number(pJVar6,"wrrl");
    lVar9 = lround(dVar2);
    RVar1 = (this->curr).eRequType;
    if (RVar1 == RT_REQU_NEAREST_METAR) {
      lVar9 = 0x32;
LAB_00194401:
      if (0 < lVar7) goto LAB_00194406;
    }
    else {
      if (RVar1 != RT_REQU_TRAFFIC) goto LAB_00194401;
      if (lVar7 < 0x1f41) {
        lVar7 = 8000;
      }
LAB_00194406:
      lVar11 = std::chrono::_V2::steady_clock::now();
      (this->tNextTraffic).__d.__r = lVar7 * 1000000 + lVar11;
    }
    if (0 < lVar9) {
      lVar7 = std::chrono::_V2::steady_clock::now();
      (this->tNextWeather).__d.__r = lVar9 * 1000000 + lVar7;
    }
    switch((this->curr).eRequType) {
    case RT_REQU_AUTH:
      dVar2 = json_object_dotget_number(pJVar6,"type");
      lVar7 = lround(dVar2);
      this->eLicType = (RTLicTypeTy)lVar7;
      pcVar8 = jog_s(pJVar6,"GUID");
      std::__cxx11::string::operator=((string *)&(this->curr).sGUID,pcVar8);
      if ((this->curr).sGUID._M_string_length == 0) {
        if ((int)dataRefs.iLogLevel < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                 ,0x21d,"ProcessFetchedData",logERR,"Did not actually receive a GUID:\n%s",
                 (this->super_LTFlightDataChannel).super_LTOnlineChannel.netData);
        }
        (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8]
        )(this);
        goto LAB_001943c2;
      }
      bVar4 = true;
      if ((int)dataRefs.iLogLevel < 1) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
               ,0x222,"ProcessFetchedData",logDEBUG,"Authenticated: type=%d, GUID=%s",
               (ulong)this->eLicType,(this->curr).sGUID._M_dataplus._M_p);
      }
      break;
    case RT_REQU_DEAUTH:
      (this->curr).sGUID._M_string_length = 0;
      *(this->curr).sGUID._M_dataplus._M_p = '\0';
      bVar4 = true;
      if ((int)dataRefs.iLogLevel < 1) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
               ,0x229,"ProcessFetchedData",logDEBUG,"De-authenticated");
      }
      break;
    case RT_REQU_PARKED:
      this->bDoParkedTraffic = false;
      pJVar6 = json_object_get_object(pJVar6,"data");
      bVar4 = ProcessParkedAcBuffer(this,pJVar6);
      break;
    case RT_REQU_NEAREST_METAR:
      pData = json_object_get_array(pJVar6,"data");
      bVar4 = true;
      ProcessNearestMETAR(this,pData);
      break;
    case RT_REQU_WEATHER:
      local_80 = jog_n_nan(pJVar6,"data.QNH");
      if (NAN(local_80)) {
        local_80 = jog_n_nan(pJVar6,"data.locWX.SLP");
      }
      pcVar8 = jog_s(pJVar6,"data.locWX.Error");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,pcVar8,(allocator<char> *)&local_70);
      if (local_a8._M_string_length == 0) {
        pcVar8 = jog_s(pJVar6,"data.locWX.Info");
        std::__cxx11::string::operator=((string *)&local_a8,pcVar8);
        if (local_a8._M_string_length != 0) {
          iVar5 = std::__cxx11::string::compare((char *)&local_a8);
          if (iVar5 != 0) {
            std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_a8);
            iVar5 = std::__cxx11::string::compare((char *)&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if (iVar5 != 0) {
              local_a8._M_string_length = 0;
              *local_a8._M_dataplus._M_p = '\0';
            }
          }
          if (local_a8._M_string_length != 0) goto LAB_0019453e;
        }
        if (local_80 < 800.0) goto LAB_0019453e;
        pcVar8 = jog_s(pJVar6,"data.ICAO");
        std::__cxx11::string::operator=((string *)&local_a8,pcVar8);
        pcVar8 = jog_s(pJVar6,"data.METAR");
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar8,&local_71);
        if ((local_a8._M_string_length == 0) ||
           (iVar5 = std::__cxx11::string::compare((char *)&local_a8), iVar5 == 0)) {
          local_a8._M_string_length = 0;
          *local_a8._M_dataplus._M_p = '\0';
          local_70._M_string_length = 0;
          *local_70._M_dataplus._M_p = '\0';
        }
        if ((this->curr).tOff < 1) {
          fVar17 = DataRefs::SetWeather
                             (&dataRefs,(float)local_80,(float)(this->rtWx).pos._lat,
                              (float)(this->rtWx).pos._lon,&local_a8,&local_70);
        }
        else {
          fVar17 = WeatherQNHfromMETAR(&local_70);
        }
        (this->rtWx).w.qnh_pas = fVar17;
        if (!NAN(fVar17)) {
          local_80 = (double)fVar17;
        }
        lVar7 = (this->curr).tOff;
        (this->rtWx).QNH = local_80;
        (this->rtWx).tOff = lVar7;
        lVar7 = std::chrono::_V2::steady_clock::now();
        (this->rtWx).next.__d.__r = lVar7 + 60000000000;
        (this->rtWx).nErr = 0;
        if ((int)dataRefs.iLogLevel < 1) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                 ,0x27c,"ProcessFetchedData",logDEBUG,"Received RealTraffic Weather with QNH = %.1f"
                 ,SUB84((this->rtWx).QNH,0));
        }
        if (dataRefs.weatherCtl == WC_REAL_TRAFFIC) {
          pJVar6 = json_object_get_object(pJVar6,"data");
          ProcessWeather(this,pJVar6);
          if (NAN((this->rtWx).w.qnh_pas)) {
            (this->rtWx).w.qnh_pas = (float)(this->rtWx).QNH;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        bVar4 = true;
      }
      else {
LAB_0019453e:
        iVar5 = std::__cxx11::string::compare((char *)&local_a8);
        if (iVar5 == 0) {
          if ((int)dataRefs.iLogLevel < 1) {
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                   ,0x249,"ProcessFetchedData",logDEBUG,
                   "Weather details being fetched at RealTraffic, will try again in 60s");
          }
        }
        else if (local_a8._M_string_length == 0) {
          if ((int)dataRefs.iLogLevel < 4) {
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                   ,0x251,"ProcessFetchedData",logERR,
                   "RealTraffic returned no or invalid local pressure %.1f:\n%s",SUB84(local_80,0),
                   (this->super_LTFlightDataChannel).super_LTOnlineChannel.netData);
          }
        }
        else if ((int)dataRefs.iLogLevel < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                 ,0x24e,"ProcessFetchedData",logERR,
                 "Requesting RealTraffic weather returned error \'%s\':\n%s",
                 local_a8._M_dataplus._M_p,
                 (this->super_LTFlightDataChannel).super_LTOnlineChannel.netData);
        }
        iVar5 = (this->rtWx).nErr;
        (this->rtWx).nErr = iVar5 + 1;
        if (NAN((this->rtWx).QNH)) {
          if (iVar5 < 4) {
            lVar7 = std::chrono::_V2::steady_clock::now();
            (this->tNextWeather).__d.__r = lVar7 + 60000000000;
          }
          else {
            if ((int)dataRefs.iLogLevel < 4) {
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                     ,0x25a,"ProcessFetchedData",logERR,
                     "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude."
                    );
            }
            CreateMsgWindow(12.0,logERR,
                            "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude."
                           );
            lVar7 = (this->curr).tOff;
            (this->rtWx).QNH = 1013.25;
            (this->rtWx).tOff = lVar7;
            lVar7 = std::chrono::_V2::steady_clock::now();
            (this->rtWx).next.__d.__r = lVar7 + 60000000000;
            (this->rtWx).pos._lat = NAN;
            (this->rtWx).pos._lon = NAN;
            (this->rtWx).pos._alt = NAN;
            (this->rtWx).pos._ts = NAN;
            (this->rtWx).pos._head = NAN;
            (this->rtWx).pos._pitch = NAN;
            (this->rtWx).pos._roll = NAN;
            (this->rtWx).pos.mergeCount = 1;
            (this->rtWx).pos.f = (posFlagsTy)0x0;
            (this->rtWx).pos.edgeIdx = 0xffffffffffffffff;
          }
        }
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      break;
    default:
      dVar2 = json_object_dotget_number(pJVar6,"dataepoch");
      lVar7 = lround(dVar2);
      if (0x5c2b5640 < lVar7) {
        if ((long)(dataRefs.fdBufPeriod / 2) + (long)dataRefs.lastSimTime < lVar7) {
          if (0.0 < this->tsAdjust) {
            if ((int)dataRefs.iLogLevel < 2) {
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                     ,0x29b,"ProcessFetchedData",logINFO,
                     "RealTraffic: Tracking data is real-time again.");
            }
            CreateMsgWindow(8.0,logINFO,"RealTraffic: Tracking data is real-time again.");
          }
          this->tsAdjust = 0.0;
        }
        else {
          lVar7 = (long)dataRefs.lastSimTime - lVar7;
          lVar7 = SUB168(SEXT816(lVar7 + dataRefs.fdBufPeriod + -10) * SEXT816(-0x7777777777777777),
                         8) + lVar7 + dataRefs.fdBufPeriod + -10;
          lVar7 = ((lVar7 >> 5) - (lVar7 >> 0x3f)) * 0x3c + 0x3c;
          if (lVar7 != (long)this->tsAdjust) {
            this->tsAdjust = (double)lVar7;
            if ((int)dataRefs.iLogLevel < 2) {
              GetAdjustTSText_abi_cxx11_(&local_a8,this);
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                     ,0x2a6,"ProcessFetchedData",logINFO,
                     "RealTraffic: Receive and display past tracking data from %s",
                     local_a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            GetAdjustTSText_abi_cxx11_(&local_a8,this);
            CreateMsgWindow(8.0,logINFO,
                            "RealTraffic: Receive and display past tracking data from %s",
                            local_a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      dVar2 = json_object_dotget_number(pJVar6,"full_count");
      lVar7 = lround(dVar2);
      this->lTotalFlights = lVar7;
      if ((lVar7 == 0) &&
         (dVar12.__r = std::chrono::_V2::steady_clock::now(),
         300000000000 < dVar12.__r - (long)ProcessFetchedData::prevWarn.__d.__r)) {
        pcVar8 = "(full_count=0)";
        if ((int)dataRefs.iLogLevel < 3) {
          pcVar14 = "(full_count=0)";
          if (0 < (this->curr).tOff) {
            pcVar14 = "Maybe requested historic data too far in the past?";
          }
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                 ,0x2b3,"ProcessFetchedData",logWARN,"RealTraffic has no traffic at all! %s",pcVar14
                );
        }
        if (0 < (this->curr).tOff) {
          pcVar8 = "Maybe requested historic data too far in the past?";
        }
        CreateMsgWindow(8.0,logWARN,"RealTraffic has no traffic at all! %s",pcVar8);
        ProcessFetchedData::prevWarn.__d.__r = (duration)(duration)dVar12.__r;
      }
      pJVar6 = json_object_get_object(pJVar6,"data");
      if (pJVar6 == (JSON_Object *)0x0) {
        if ((int)dataRefs.iLogLevel < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                 ,0x2bd,"ProcessFetchedData",logERR,
                 "Response is missing the \'data\' object that would have the aircraft data!");
        }
        (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8]
        )(this);
        goto LAB_001943c2;
      }
      iVar5 = json_object_has_value_of_type(pJVar6,"buffer_0",4);
      if (iVar5 == 0) {
        bVar4 = ProcessTrafficBuffer(this,pJVar6);
      }
      else {
        sVar13 = json_object_get_count(pJVar6);
        bVar4 = true;
        if (0 < (int)(uint)sVar13) {
          uVar16 = (uint)sVar13;
          do {
            uVar15 = uVar16 - 1;
            snprintf((char *)&local_a8,0x14,"buffer_%d",(ulong)uVar15);
            pBuf = json_object_get_object(pJVar6,(char *)&local_a8);
            bVar3 = ProcessTrafficBuffer(this,pBuf);
            if (!bVar3 && uVar15 == 0) {
              if ((int)dataRefs.iLogLevel < 3) {
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                       ,0x2cd,"ProcessFetchedData",logWARN,"Couldn\'t process \'buffer_0\'!");
              }
              (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                _vptr_LTChannel[8])(this);
              goto LAB_001943c2;
            }
            bVar3 = 1 < uVar16;
            uVar16 = uVar15;
          } while (bVar3);
        }
      }
    }
    goto LAB_001943c4;
  }
LAB_001943c2:
  bVar4 = false;
LAB_001943c4:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
LAB_001943df:
  json_value_free(value);
  return bVar4;
}

Assistant:

bool RealTrafficConnection::ProcessFetchedData ()
{
    // No data!
    if (!netDataPos) {
        if (httpResponse != HTTP_OK)
            IncErrCnt();
        return false;
    }
    
    // Try to parse as JSON...even in case of errors we might be getting a body
    // Unique_ptr ensures it is freed before leaving the function
    JSONRootPtr pRoot (netData);
    if (!pRoot) { LOG_MSG(logERR,ERR_JSON_PARSE); IncErrCnt(); return false; }
    JSON_Object* pObj = json_object(pRoot.get());
    if (!pObj) { LOG_MSG(logERR,ERR_JSON_MAIN_OBJECT); IncErrCnt(); return false; }
    
    // Try the error fields first
    long rStatus = jog_l(pObj, "status");
    if (!rStatus) { LOG_MSG(logERR,"Response has no 'status'"); IncErrCnt(); return false; }
    
    std::string rMsg = jog_s(pObj, "message");
    
    // --- Error processing ---
    
    // For failed weather requests keep a separate counter
    if (curr.eRequType == CurrTy::RT_REQU_WEATHER && rStatus != HTTP_OK) {
        if (++rtWx.nErr >= RT_DRCT_MAX_WX_ERR) { // Too many WX errors?
            SHOW_MSG(logERR, "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude.");
        }
    }
    
    switch (rStatus) {
        case HTTP_OK:
            break;                                  // All good, just continue
            
        case HTTP_PAYMENT_REQU:
        case HTTP_NOT_FOUND:
            if (curr.eRequType == CurrTy::RT_REQU_AUTH) {
                SHOW_MSG(logERR, "RealTraffic license invalid: %s", rMsg.c_str());
                SetValid(false,true);               // set invalid, stop trying
                return false;
            } else {
                LOG_MSG(logWARN, "RealTraffic returned: %s", rMsg.c_str());
                IncErrCnt();
                tNextTraffic = tNextWeather = std::chrono::steady_clock::now() + RT_DRCT_ERR_WAIT;
                return false;
            }
            
        case HTTP_METH_NOT_ALLWD:                   // Send for "too many sessions" / "request rate violation"
            LOG_MSG(logERR, "RealTraffic: %s", rMsg.c_str());
            IncErrCnt();
            // documentation says "wait 10 seconds"
            tNextTraffic = tNextWeather = std::chrono::steady_clock::now() + RT_DRCT_ERR_RATE;
            curr.sGUID.clear();                     // force re-login
            return false;
            
        case HTTP_UNAUTHORIZED:                     // means our GUID expired
            LOG_MSG(logDEBUG, "Session expired");
            curr.sGUID.clear();                     // re-login immediately
            tNextTraffic = tNextWeather = std::chrono::steady_clock::now();
            return false;
            
        case HTTP_FORBIDDEN:
            LOG_MSG(logWARN, "RealTraffic forbidden: %s", rMsg.c_str());
            IncErrCnt();
            tNextTraffic = tNextWeather = std::chrono::steady_clock::now() + RT_DRCT_ERR_WAIT;
            return false;
            
        case HTTP_INTERNAL_ERR:
        default:
            SHOW_MSG(logERR, "RealTraffic returned an error: %s", rMsg.c_str());
            IncErrCnt();
            tNextTraffic = tNextWeather = std::chrono::steady_clock::now() + RT_DRCT_ERR_WAIT;
            return false;
    }
    
    // All good, process the request
    
    // Wait till next request?
    long rrl = jog_l(pObj, "rrl");                  // Wait time till next request, separately for traffic and weather
    long wrrl = jog_l(pObj, "wrrl");
    switch (curr.eRequType) {
        case CurrTy::RT_REQU_AUTH:                  // in most cases we continue as quickly as possible
        case CurrTy::RT_REQU_DEAUTH:
        case CurrTy::RT_REQU_PARKED:
        case CurrTy::RT_REQU_WEATHER:
            break;
        case CurrTy::RT_REQU_NEAREST_METAR:         // after learning the META we continue quickly with the weather request
            wrrl = 50;
            break;
        case CurrTy::RT_REQU_TRAFFIC:               // By default we wait at least 8s, or more if RealTraffic instructs us so
            if (rrl < RT_DRCT_DEFAULT_WAIT)
                rrl = RT_DRCT_DEFAULT_WAIT;
            break;
    }
    if (rrl > 0)
        tNextTraffic = std::chrono::steady_clock::now() + std::chrono::milliseconds(rrl);
    if (wrrl > 0)
        tNextWeather = std::chrono::steady_clock::now() + std::chrono::milliseconds(wrrl);
    
    // --- Authorization ---
    if (curr.eRequType == CurrTy::RT_REQU_AUTH) {
        eLicType = RTLicTypeTy(jog_l(pObj, "type"));
        curr.sGUID = jog_s(pObj, "GUID");
        if (curr.sGUID.empty()) {
            LOG_MSG(logERR, "Did not actually receive a GUID:\n%s", netData);
            IncErrCnt();
            return false;
        }
        LOG_MSG(logDEBUG, "Authenticated: type=%d, GUID=%s",
                eLicType, curr.sGUID.c_str());
        return true;
    }
    
    // --- De-authentication (closing the session) ---
    if (curr.eRequType == CurrTy::RT_REQU_DEAUTH) {
        curr.sGUID.clear();
        LOG_MSG(logDEBUG, "De-authenticated");
        return true;
    }
    
    // --- Nearest METAR location ---
    if (curr.eRequType == CurrTy::RT_REQU_NEAREST_METAR) {
        ProcessNearestMETAR(json_object_get_array(pObj, "data"));
        return true;
    }
    
    // --- Weather ---
    if (curr.eRequType == CurrTy::RT_REQU_WEATHER) {
        // Here, we are interested in just a single value: local Pressure
        double wxQNH = jog_n_nan(pObj, "data.QNH");         // ideally QNH
        if (std::isnan(wxQNH))
            wxQNH = jog_n_nan(pObj, "data.locWX.SLP");      // of not given then SLP
        
        // Error in locWX data?
        std::string s = jog_s(pObj, "data.locWX.Error");                    // sometimes errors are given in a specific field
        if (s.empty()) {                                                    // and at other times there is something in the 'Info' field...not very consistent
            s = jog_s(pObj, "data.locWX.Info");
            if (!s.empty() &&
                s != "TinyDelta" &&                                         // if we request too often then Info is 'TinyDelta', and we let it sit in 's'
                s.substr(0,6) != "error:")                                  // any error starts with "error:" and we let it sit in 's'
                s.clear();
        }
        
        // Any error, either explicitely or because local pressure is bogus?
        if (!s.empty() || std::isnan(wxQNH) || wxQNH < 800.0)
        {
            if (s == "File requested") {
                // Error "File requested" often occurs when requesting historic weather that isn't cached on the server, so we only issue debug-level message
                LOG_MSG(logDEBUG, "Weather details being fetched at RealTraffic, will try again in 60s");
            } else {
                // Anything else is unexpected
                if (!s.empty()) {
                    LOG_MSG(logERR, "Requesting RealTraffic weather returned error '%s':\n%s",
                            s.c_str(), netData);
                } else {
                    LOG_MSG(logERR, "RealTraffic returned no or invalid local pressure %.1f:\n%s",
                            wxQNH, netData);
                }
            }
            // one more error
            ++rtWx.nErr;
            // If we don't yet have any pressure...
            if (std::isnan(rtWx.QNH)) {
                // Too many WX errors? We give up and just use standard pressure
                if (rtWx.nErr >= RT_DRCT_MAX_WX_ERR) {
                    SHOW_MSG(logERR, "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude.");
                    rtWx.set(HPA_STANDARD, curr.tOff, false);
                    rtWx.pos = positionTy();
                } else {
                    // We will request weather directly again, but need to wait 60s for it
                    tNextWeather = std::chrono::steady_clock::now() + std::chrono::seconds(60);
                }
            }
            return false;
        }
        
        // If we have METAR info pass that on, too
        s = jog_s(pObj, "data.ICAO");
        std::string metar = jog_s(pObj, "data.METAR");
        
        if (s.empty() || s == "UNKN") {         // ignore no/unknown METAR
            s.clear();
            metar.clear();
        }
            
        // If this is live data, not historic, then we can use it instead of separately querying METAR
        if (!isHistoric()) {
            rtWx.w.qnh_pas = dataRefs.SetWeather((float)wxQNH,
                                                 (float)rtWx.pos.lat(), (float)rtWx.pos.lon(),
                                                 s, metar);
        }
        // historic data
        else {
            // Try reading QNH from METAR
            rtWx.w.qnh_pas = WeatherQNHfromMETAR(metar);
        }
        
        // Successfully received local pressure information
        rtWx.set(std::isnan(rtWx.w.qnh_pas) ? wxQNH : double(rtWx.w.qnh_pas), curr.tOff);   // Save new QNH
        LOG_MSG(logDEBUG, "Received RealTraffic Weather with QNH = %.1f", rtWx.QNH);
        
        // If requested to set X-Plane's weather based on detailed weather data
        if (dataRefs.GetWeatherControl() == WC_REAL_TRAFFIC) {
            ProcessWeather (json_object_get_object(pObj, "data"));
            if (std::isnan(rtWx.w.qnh_pas))
                rtWx.w.qnh_pas = float(rtWx.QNH);
        }
        
        return true;
    }
    
    // --- Parked Aircraft ---
    if (curr.eRequType == CurrTy::RT_REQU_PARKED) {
        bDoParkedTraffic = false;                       // Repeat only when instructed
        return ProcessParkedAcBuffer(json_object_get_object(pObj, "data"));
    }

    // --- Traffic data ---
    
    // In `dataepoch` RealTraffic delivers the point in time when the data was valid.
    // That is relevant especially for historic data, when `dataepoch` is in the past.
    const long epoch = jog_l(pObj, "dataepoch");
    if (epoch > long(JAN_FIRST_2019))
    {
        // "now" is the simulated time plus the buffering period
        const long simTime  = long(dataRefs.GetSimTime());
        const long bufTime  = long(dataRefs.GetFdBufPeriod());
        // As long as the timestamp is half the buffer time close to "now" we consider the data current, ie. non-historic
        if (epoch > simTime + bufTime/2) {
            if (tsAdjust > 0.0) {                       // is that a change from historic delivery?
                SHOW_MSG(logINFO, INFO_RT_REAL_TIME);
            }
            tsAdjust = 0.0;
        }
        // we have historic data
        else {
            long diff = simTime + bufTime - epoch;      // difference between "now"
            diff -= 10;                                 // rounding 10s above the minute down,
            diff += 60 - diff % 60;                     // everything else up to the next minute
            if (long(tsAdjust) != diff) {               // is this actually a change?
                tsAdjust = double(diff);
                SHOW_MSG(logINFO, INFO_RT_ADJUST_TS, GetAdjustTSText().c_str());
            }
        }
    }